

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::DefinePropertiesHelperForProxyObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  code *pcVar1;
  size_t scriptContext_00;
  ScriptContext *obj;
  RecyclableObject *obj_00;
  bool bVar2;
  int iVar3;
  PropertyId PVar4;
  PropertyId propertyId_00;
  BOOL BVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  undefined4 extraout_var;
  Var propertySpec;
  PropertyRecord *pPVar8;
  char16 *varName;
  JavascriptArray *local_d8;
  size_t i;
  PropertyDescriptor propertyDescriptor;
  uint32 j;
  Var descObj;
  PropertyRecord *pPStack_88;
  PropertyId propertyId;
  PropertyRecord *propertyRecord;
  Var nextKey;
  undefined8 local_70;
  TrackAllocData local_68;
  DescriptorMap *local_40;
  DescriptorMap *descriptors;
  JavascriptArray *pJStack_30;
  uint32 length;
  JavascriptArray *keys;
  size_t descCount;
  ScriptContext *scriptContext_local;
  RecyclableObject *props_local;
  RecyclableObject *object_local;
  
  descCount = (size_t)scriptContext;
  scriptContext_local = (ScriptContext *)props;
  props_local = object;
  bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(props);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x7b8,"(VarIs<JavascriptProxy>(props))",
                                "VarIs<JavascriptProxy>(props)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  keys = (JavascriptArray *)0x0;
  pJStack_30 = Js::JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols
                         ((RecyclableObject *)scriptContext_local,(ScriptContext *)descCount);
  descriptors._4_4_ = ArrayObject::GetLength(&pJStack_30->super_ArrayObject);
  EnterPinnedScope(&local_40);
  pRVar7 = ScriptContext::GetRecycler((ScriptContext *)descCount);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,
             (type_info *)
             &DefinePropertiesHelperForProxyObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
              ::DescriptorMap::typeinfo,0,(ulong)descriptors._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
             ,0x7cb);
  pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_68);
  nextKey = Memory::Recycler::Alloc;
  local_70 = 0;
  local_40 = Memory::
             AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForProxyObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                       ((Memory *)pRVar7,(Recycler *)Memory::Recycler::Alloc,0,
                        (ulong)descriptors._4_4_);
  pPStack_88 = (PropertyRecord *)0x0;
  propertyDescriptor._44_4_ = 0;
  do {
    if (descriptors._4_4_ <= (uint)propertyDescriptor._44_4_) {
      for (local_d8 = (JavascriptArray *)0x0; obj_00 = props_local, local_d8 < keys;
          local_d8 = (JavascriptArray *)
                     ((long)&(local_d8->super_ArrayObject).super_DynamicObject.
                             super_RecyclableObject.super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1)) {
        pPVar8 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                           (&local_40[(long)local_d8].propRecord);
        PVar4 = PropertyRecord::GetPropertyId(pPVar8);
        DefineOwnPropertyHelper
                  (obj_00,PVar4,&local_40[(long)local_d8].descriptor,(ScriptContext *)descCount,true
                  );
      }
      LeavePinnedScope();
      return props_local;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&i);
    iVar3 = (*(pJStack_30->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJStack_30,(ulong)(uint)propertyDescriptor._44_4_);
    propertyRecord = (PropertyRecord *)CONCAT44(extraout_var,iVar3);
    bVar2 = VarIs<Js::JavascriptSymbol>(propertyRecord);
    if ((!bVar2) && (bVar2 = VarIs<Js::JavascriptString>(propertyRecord), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x7df,
                                  "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                  ,
                                  "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    JavascriptConversion::ToPropertyKey
              (propertyRecord,(ScriptContext *)descCount,&stack0xffffffffffffff78,
               (PropertyString **)0x0);
    PVar4 = PropertyRecord::GetPropertyId(pPStack_88);
    if (PVar4 == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x7e2,"(propertyId != Constants::NoProperty)",
                                  "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty."
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    obj = scriptContext_local;
    propertyId_00 = PropertyRecord::GetPropertyId(pPStack_88);
    BVar5 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                      ((RecyclableObject *)obj,propertyId_00,(ScriptContext *)descCount,
                       (PropertyDescriptor *)&i);
    if ((BVar5 != 0) && (bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)&i), bVar2))
    {
      propertySpec = Js::JavascriptOperators::GetProperty
                               ((RecyclableObject *)scriptContext_local,PVar4,
                                (ScriptContext *)descCount,(PropertyValueInfo *)0x0);
      BVar5 = Js::JavascriptOperators::ToPropertyDescriptor
                        (propertySpec,&local_40[(long)keys].descriptor,(ScriptContext *)descCount);
      scriptContext_00 = descCount;
      if (BVar5 == 0) {
        pPVar8 = ScriptContext::GetPropertyName((ScriptContext *)descCount,PVar4);
        varName = PropertyRecord::GetBuffer(pPVar8);
        JavascriptError::ThrowTypeError((ScriptContext *)scriptContext_00,-0x7ff5ec2c,varName);
      }
      if ((DAT_01ec73cb & 1) != 0) {
        ModifyGetterSetterFuncName
                  (pPStack_88,&local_40[(long)keys].descriptor,(ScriptContext *)descCount);
      }
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
                (&local_40[(long)keys].propRecord,pPStack_88);
      keys = (JavascriptArray *)
             ((long)&(keys->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject + 1);
    }
    propertyDescriptor._44_4_ = propertyDescriptor._44_4_ + 1;
  } while( true );
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForProxyObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    Assert(VarIs<JavascriptProxy>(props));

    //1.  If Type(O) is not Object throw a TypeError exception.
    //2.  Let props be ToObject(Properties).

    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
    };

    //3.  Let keys be props.[[OwnPropertyKeys]]().
    //4.  ReturnIfAbrupt(keys).
    //5.  Let descriptors be an empty List.
    JavascriptArray* keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(props, scriptContext);
    uint32 length = keys->GetLength();

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, length);

    //6.  Repeat for each element nextKey of keys in List order,
    //    1.  Let propDesc be props.[[GetOwnProperty]](nextKey).
    //    2.  ReturnIfAbrupt(propDesc).
    //    3.  If propDesc is not undefined and propDesc.[[Enumerable]] is true, then
    //        1.  Let descObj be Get(props, nextKey).
    //        2.  ReturnIfAbrupt(descObj).
    //        3.  Let desc be ToPropertyDescriptor(descObj).
    //        4.  ReturnIfAbrupt(desc).
    //        5.  Append the pair(a two element List) consisting of nextKey and desc to the end of descriptors.
    Var nextKey;

    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var descObj;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty.");

        if (JavascriptOperators::GetOwnPropertyDescriptor(props, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                descObj = JavascriptOperators::GetProperty(props, propertyId, scriptContext);

                if (!JavascriptOperators::ToPropertyDescriptor(descObj, &descriptors[descCount].descriptor, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyId)->GetBuffer());
                }

                if (CONFIG_FLAG(UseFullName))
                {
                    ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
                }

                descriptors[descCount].propRecord = propertyRecord;

                descCount++;
            }
        }
    }

    //7.  For each pair from descriptors in list order,
    //    1.  Let P be the first element of pair.
    //    2.  Let desc be the second element of pair.
    //    3.  Let status be DefinePropertyOrThrow(O, P, desc).
    //    4.  ReturnIfAbrupt(status).

    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    //8.  Return O.
    return object;
}